

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleObj(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *origObj)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar5;
  soplex *psVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  byte bVar8;
  soplex asStack_118 [112];
  int local_a8;
  undefined1 local_a4;
  undefined8 local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_98;
  
  bVar8 = 0;
  uVar1 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).scaleExp.data[i];
  lVar3 = 0x1c;
  puVar4 = (uint *)origObj;
  psVar6 = asStack_118;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(uint *)psVar6 = *puVar4;
    puVar4 = puVar4 + 1;
    psVar6 = (soplex *)((long)psVar6 + 4);
  }
  local_a8 = (origObj->m_backend).exp;
  local_a4 = (origObj->m_backend).neg;
  local_a0._0_4_ = (origObj->m_backend).fpclass;
  local_a0._4_4_ = (origObj->m_backend).prec_elem;
  spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&local_98,asStack_118,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(ulong)uVar1,(undefined4)local_a0);
  pnVar5 = &local_98;
  pnVar7 = __return_storage_ptr__;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)((long)pnVar5 + ((ulong)bVar8 * -2 + 1) * 4);
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = local_98.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = local_98.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_98.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_98.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::scaleObj(const SPxLPBase<R>& lp, int i, R origObj) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   int exp = colscaleExp[i];

   return spxLdexp(origObj, exp);
}